

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O0

uint __thiscall Kernel::Term::numTypeArguments(Term *this)

{
  bool bVar1;
  uint uVar2;
  Signature *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  
  bVar1 = isSpecial((Term *)0x9825e8);
  if (bVar1) {
    uVar2 = 0;
  }
  else {
    bVar1 = isLiteral((Term *)0x982600);
    if (bVar1) {
      Signature::getPredicate(in_RDI,in_stack_ffffffffffffffec);
      uVar2 = Signature::Symbol::numTypeArguments
                        ((Symbol *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    }
    else {
      Signature::getFunction(in_RDI,in_stack_ffffffffffffffec);
      uVar2 = Signature::Symbol::numTypeArguments
                        ((Symbol *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    }
  }
  return uVar2;
}

Assistant:

unsigned Term::numTypeArguments() const {
  ASS(!isSort());

  return isSpecial()
    ? 0
    : isLiteral()
      ? env.signature->getPredicate(_functor)->numTypeArguments()
      : env.signature->getFunction(_functor)->numTypeArguments();
}